

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  MElementType MVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  TPZGeoEl *gel;
  undefined4 extraout_var;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int64_t size;
  char *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  TPZManVector<long,_4> nodeindices;
  int faceSide;
  TPZStack<int,_10> LowAllSides;
  int64_t index;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide BCGelside;
  TPZGeoElSide thisside;
  TPZManVector<long,_4> local_190;
  int local_14c;
  TPZManVector<int,_10> local_148;
  undefined1 local_f8 [8];
  TPZManVector<int,_27> local_f0;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  if ((uint)side < 0x15) {
    if (side != 0x14) {
      local_14c = 0;
      size = 1;
      iVar5 = pztopology::TPZPrism::NumSides(1);
      local_14c = (side - iVar5) + -6;
      iVar5 = pztopology::TPZPrism::GetSideOrient(&local_14c);
      MVar6 = pztopology::TPZPrism::Type(side);
      uVar7 = pztopology::TPZPrism::NSideNodes(side);
      switch(MVar6) {
      case EPoint:
        break;
      case EOned:
        size = 3;
        break;
      case ETriangle:
        size = 7;
        break;
      case EQuadrilateral:
        size = 9;
        break;
      default:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                   ,0x124);
      }
      local_148.super_TPZVec<int>._vptr_TPZVec =
           (_func_int **)((ulong)local_148.super_TPZVec<int>._vptr_TPZVec._4_4_ << 0x20);
      TPZManVector<int,_27>::TPZManVector(&local_f0,size,(int *)&local_148);
      auVar2 = _DAT_014f8350;
      uVar12 = (int)size + (uint)((int)size == 0);
      lVar10 = (ulong)uVar12 - 1;
      auVar15._8_4_ = (int)lVar10;
      auVar15._0_8_ = lVar10;
      auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar15 = auVar15 ^ _DAT_014f8350;
      auVar16 = _DAT_014f8340;
      do {
        auVar17 = auVar16 ^ auVar2;
        if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                    auVar15._4_4_ < auVar17._4_4_) & 1)) {
          local_f0.super_TPZVec<int>.fStore[uVar11] = (int)uVar11;
        }
        if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
            auVar17._12_4_ <= auVar15._12_4_) {
          local_f0.super_TPZVec<int>.fStore[uVar11 + 1] = (int)uVar11 + 1;
        }
        uVar11 = uVar11 + 2;
        lVar10 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar10 + 2;
      } while ((uVar12 + 1 & 0x1e) != uVar11);
      if (iVar5 == -1) {
        if (MVar6 == EQuadrilateral) {
          local_148.super_TPZVec<int>.fNElements._0_4_ = 7;
          local_148.super_TPZVec<int>.fNElements._4_4_ = 6;
          local_148.super_TPZVec<int>.fNAlloc._0_4_ = 5;
          local_148.super_TPZVec<int>.fNAlloc._4_4_ = 4;
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x300000000;
          local_148.super_TPZVec<int>.fStore._0_4_ = 2;
          local_148.super_TPZVec<int>.fStore._4_4_ = 1;
          local_148.fExtAlloc[0] = 8;
          local_190.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
          local_190.super_TPZVec<long>.fStore = (long *)0x9;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_190);
        }
        else if (MVar6 == ETriangle) {
          local_148.super_TPZVec<int>.fNElements._0_4_ = 4;
          local_148.super_TPZVec<int>.fNElements._4_4_ = 3;
          local_148.super_TPZVec<int>.fNAlloc._0_4_ = 6;
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x200000000;
          local_148.super_TPZVec<int>.fStore._0_4_ = 1;
          local_148.super_TPZVec<int>.fStore._4_4_ = 5;
          local_190.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
          local_190.super_TPZVec<long>.fStore = (long *)0x7;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_190);
        }
        else if (MVar6 == EOned) {
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&local_190;
          local_190.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x1;
          local_190.super_TPZVec<long>.fStore =
               (long *)CONCAT44(local_190.super_TPZVec<long>.fStore._4_4_,2);
          local_148.super_TPZVec<int>.fStore._0_4_ = 3;
          local_148.super_TPZVec<int>.fStore._4_4_ = 0;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_148);
        }
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_148);
      pztopology::TPZPrism::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_148);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_148,side);
      bVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::IsLinearMapping(&this->fGeo,side);
      if (0 < CONCAT44(local_148.super_TPZVec<int>.fNElements._4_4_,
                       (undefined4)local_148.super_TPZVec<int>.fNElements)) {
        lVar10 = 0;
        do {
          iVar13 = *(int *)(CONCAT44(local_148.super_TPZVec<int>.fStore._4_4_,
                                     local_148.super_TPZVec<int>.fStore._0_4_) + lVar10 * 4);
          iVar8 = 9;
          if (5 < iVar13) {
            bVar4 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::IsLinearMapping(&this->fGeo,iVar13);
            if (!bVar4) {
              bVar3 = false;
            }
            iVar8 = 7;
            if (bVar3 != false) {
              iVar8 = 0;
            }
          }
        } while (((iVar8 == 9) || (iVar8 == 0)) &&
                (lVar10 = lVar10 + 1,
                lVar10 < CONCAT44(local_148.super_TPZVec<int>.fNElements._4_4_,
                                  (undefined4)local_148.super_TPZVec<int>.fNElements)));
      }
      if (bVar3 == false) {
        gel = (TPZGeoEl *)
              (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_f0);
      }
      else {
        TPZManVector<long,_4>::TPZManVector(&local_190,(long)(int)uVar7);
        if (0 < (int)uVar7) {
          uVar11 = 0;
          do {
            if (iVar5 == -1) {
              iVar13 = local_f0.super_TPZVec<int>.fStore[uVar11];
            }
            else {
              iVar13 = (int)uVar11;
            }
            lVar10 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))
                               (this,side,uVar11 & 0xffffffff);
            local_190.super_TPZVec<long>.fStore[iVar13] = lVar10;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        MVar6 = pztopology::TPZPrism::Type(side);
        pTVar1 = (this->super_TPZGeoEl).fMesh;
        iVar5 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (pTVar1,(ulong)MVar6,&local_190,(ulong)(uint)bc,local_f8,1);
        gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar5);
        TPZGeoElSide::TPZGeoElSide(&local_60,gel);
        local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
        local_48.fGeoEl = &this->super_TPZGeoEl;
        local_48.fSide = side;
        TPZGeoElSide::InsertConnectivity(&local_60,&local_48,&local_f0.super_TPZVec<int>);
        (**(code **)(*(long *)gel + 0x78))(gel);
        if (local_190.super_TPZVec<long>.fStore == local_190.fExtAlloc) {
          local_190.super_TPZVec<long>.fStore = (long *)0x0;
        }
        local_190.super_TPZVec<long>.fNAlloc = 0;
        local_190.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
        if (local_190.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_190.super_TPZVec<long>.fStore);
        }
      }
      TPZManVector<int,_10>::~TPZManVector(&local_148);
      if (local_f0.super_TPZVec<int>.fStore == local_f0.fExtAlloc) {
        local_f0.super_TPZVec<int>.fStore = (int *)0x0;
      }
      local_f0.super_TPZVec<int>.fNAlloc = 0;
      local_f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_f0.super_TPZVec<int>.fStore == (int *)0x0) {
        return gel;
      }
      operator_delete__(local_f0.super_TPZVec<int>.fStore);
      return gel;
    }
    poVar9 = (ostream *)&std::cout;
    pcVar14 = "\nCreateBCGeoEl not implemented for tridimensional sides \n";
    lVar10 = 0x39;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,side);
    pcVar14 = "\n";
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar10);
  return (TPZGeoEl *)0x0;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}